

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O2

string * __thiscall
jsonrpcpp::Entity::type_str_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(this->entity) {
  case unknown:
    __s = "unknown";
    __a = &local_9;
    break;
  case exception:
    __s = "exception";
    __a = &local_b;
    break;
  case id:
    __s = "id";
    __a = &local_a;
    break;
  case error:
    __s = "error";
    __a = &local_c;
    break;
  case response:
    __s = "response";
    __a = &local_d;
    break;
  case request:
    __s = "request";
    __a = &local_e;
    break;
  case notification:
    __s = "notification";
    __a = &local_f;
    break;
  case batch:
    __s = "batch";
    __a = &local_10;
    break;
  default:
    __s = "unknown";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Entity::type_str() const
{
    switch (entity)
    {
        case entity_t::unknown:
            return "unknown";
        case entity_t::id:
            return "id";
        case entity_t::exception:
            return "exception";
        case entity_t::error:
            return "error";
        case entity_t::response:
            return "response";
        case entity_t::request:
            return "request";
        case entity_t::notification:
            return "notification";
        case entity_t::batch:
            return "batch";
        default:
            return "unknown";
    }
}